

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

ImGuiTabBar * __thiscall ImPool<ImGuiTabBar>::Add(ImPool<ImGuiTabBar> *this)

{
  int iVar1;
  ImRect *pIVar2;
  ImVec2 *pIVar3;
  undefined8 *puVar4;
  int iVar5;
  int iVar6;
  ImGuiTabBar *pIVar7;
  ImGuiTabBar *pIVar8;
  int iVar9;
  
  iVar5 = this->FreeIdx;
  iVar9 = (this->Buf).Size;
  if (iVar5 == iVar9) {
    iVar1 = iVar9 + 1;
    iVar6 = (this->Buf).Capacity;
    if (iVar6 <= iVar9) {
      if (iVar6 == 0) {
        iVar9 = 8;
      }
      else {
        iVar9 = iVar6 / 2 + iVar6;
      }
      if (iVar9 <= iVar1) {
        iVar9 = iVar1;
      }
      if (iVar6 < iVar9) {
        pIVar8 = (ImGuiTabBar *)ImGui::MemAlloc((long)iVar9 << 7);
        pIVar7 = (this->Buf).Data;
        if (pIVar7 != (ImGuiTabBar *)0x0) {
          memcpy(pIVar8,pIVar7,(long)(this->Buf).Size << 7);
          ImGui::MemFree((this->Buf).Data);
        }
        (this->Buf).Data = pIVar8;
        (this->Buf).Capacity = iVar9;
      }
    }
    (this->Buf).Size = iVar1;
    iVar9 = this->FreeIdx + 1;
  }
  else {
    if (iVar9 <= iVar5) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                  ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
    }
    iVar9 = (this->Buf).Data[iVar5].Tabs.Size;
  }
  this->FreeIdx = iVar9;
  if ((this->Buf).Size <= iVar5) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
  }
  pIVar8 = (this->Buf).Data;
  pIVar2 = &pIVar8[iVar5].BarRect;
  (pIVar2->Min).x = 0.0;
  (pIVar2->Min).y = 0.0;
  (pIVar2->Max).x = 0.0;
  (pIVar2->Max).y = 0.0;
  pIVar7 = pIVar8 + iVar5;
  (pIVar7->Tabs).Size = 0;
  (pIVar7->Tabs).Capacity = 0;
  (pIVar7->Tabs).Data = (ImGuiTabItem *)0x0;
  pIVar7 = pIVar8 + iVar5;
  pIVar7->ID = 0;
  pIVar7->SelectedTabId = 0;
  *(undefined8 *)(&pIVar7->ID + 2) = 0;
  pIVar3 = &pIVar8[iVar5].FramePadding;
  pIVar3->x = 0.0;
  pIVar3->y = 0.0;
  pIVar3[1].x = 0.0;
  pIVar3[1].y = 0.0;
  pIVar8[iVar5].TabsNames.Buf.Data = (char *)0x0;
  pIVar8[iVar5].CurrFrameVisible = -1;
  pIVar8[iVar5].PrevFrameVisible = -1;
  pIVar7 = pIVar8 + iVar5;
  pIVar7->LastTabContentHeight = 0.0;
  pIVar7->OffsetMax = 0.0;
  *(undefined8 *)(&pIVar7->LastTabContentHeight + 2) = 0;
  pIVar7 = pIVar8 + iVar5;
  pIVar7->ScrollingAnim = 0.0;
  pIVar7->ScrollingTarget = 0.0;
  *(undefined8 *)(&pIVar7->ScrollingAnim + 2) = 0;
  puVar4 = (undefined8 *)((long)&pIVar8[iVar5].ScrollingTargetDistToVisibility + 3);
  *puVar4 = 0;
  puVar4[1] = 0;
  pIVar8[iVar5].LastTabItemIdx = -1;
  if ((this->Buf).Size <= iVar5) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
  }
  return (this->Buf).Data + iVar5;
}

Assistant:

T*          Add()                               { int idx = FreeIdx; if (idx == Buf.Size) { Buf.resize(Buf.Size + 1); FreeIdx++; } else { FreeIdx = *(int*)&Buf[idx]; } IM_PLACEMENT_NEW(&Buf[idx]) T(); return &Buf[idx]; }